

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArrayIndexEnumerator.cpp
# Opt level: O1

JavascriptString * __thiscall
Js::TypedArrayIndexEnumerator::MoveAndGetNext
          (TypedArrayIndexEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  uint uVar1;
  Type TVar2;
  uint uVar3;
  ScriptContext *this_00;
  
  *propertyId = -1;
  if (this->doneArray == false) {
    this_00 = (((((this->super_JavascriptEnumerator).super_RecyclableObject.type.ptr)->
                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    TVar2 = this->index;
    uVar1 = TVar2 + 1;
    this->index = uVar1;
    uVar3 = (((this->typedArrayObject).ptr)->super_ArrayBufferParent).super_ArrayObject.length;
    if (uVar1 < uVar3) {
      if (attributes != (PropertyAttributes *)0x0) {
        *attributes = '\x01';
      }
      this_00 = (ScriptContext *)ScriptContext::GetIntegerString(this_00,this->index);
    }
    else {
      this->index = TVar2;
      this->doneArray = true;
    }
    if (uVar1 < uVar3) {
      return (JavascriptString *)this_00;
    }
  }
  return (JavascriptString *)0x0;
}

Assistant:

JavascriptString * TypedArrayIndexEnumerator::MoveAndGetNext(PropertyId& propertyId, PropertyAttributes* attributes)
    {
        // TypedArrayIndexEnumerator follows the same logic in JavascriptArrayEnumerator,
        // but the implementation is slightly different as we don't have sparse array
        // in typed array, and typed array is a DynamicObject instead of JavascriptArray.
        propertyId = Constants::NoProperty;
        ScriptContext *scriptContext = this->GetScriptContext();

        if (!doneArray)
        {
            while (true)
            {
                uint32 lastIndex = index;
                index++;
                if ((uint32)index >= typedArrayObject->GetLength()) // End of array
                {
                    index = lastIndex;
                    doneArray = true;
                    break;
                }

                if (attributes != nullptr)
                {
                    *attributes = PropertyEnumerable;
                }

                return scriptContext->GetIntegerString(index);
            }
        }
        return nullptr;
    }